

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_bulletproof_rangeproof_verify
              (secp256k1_context *ctx,secp256k1_scratch_space *scratch,
              secp256k1_bulletproof_generators *gens,uchar *proof,size_t plen,uint64_t *min_value,
              secp256k1_pedersen_commitment *commit,size_t n_commits,size_t nbits,
              secp256k1_generator *value_gen,uchar *extra_commit,size_t extra_commit_len)

{
  int iVar1;
  long in_RCX;
  ulong *in_RDX;
  long in_RSI;
  secp256k1_ecmult_context *in_RDI;
  long in_stack_00000008;
  ulong in_stack_00000010;
  ulong in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  uint64_t *minvalue_ptr;
  secp256k1_ge *commitp_ptr;
  secp256k1_ge value_genp;
  secp256k1_ge *commitp;
  size_t i;
  int ret;
  size_t in_stack_000000f0;
  uchar **in_stack_000000f8;
  secp256k1_scratch *in_stack_00000100;
  secp256k1_ecmult_context *in_stack_00000108;
  size_t *in_stack_00000150;
  secp256k1_generator *in_stack_fffffffffffffee8;
  secp256k1_ge *in_stack_fffffffffffffef0;
  secp256k1_scratch *in_stack_fffffffffffffef8;
  secp256k1_pedersen_commitment *in_stack_ffffffffffffff08;
  secp256k1_ge *in_stack_ffffffffffffff10;
  ulong local_68;
  int local_24;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_24 = 0;
  }
  else if (in_RDX == (ulong *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_24 = 0;
  }
  else if (*in_RDX < in_stack_00000018 * 2 * in_stack_00000010) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_24 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_24 = 0;
  }
  else if (in_stack_00000008 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_24 = 0;
  }
  else if (in_stack_00000010 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_24 = 0;
  }
  else if (in_stack_00000018 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_24 = 0;
  }
  else if (in_stack_00000018 < 0x41) {
    if (in_stack_00000020 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
      local_24 = 0;
    }
    else if (in_stack_00000028 == 0 && in_stack_00000030 != 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
      local_24 = 0;
    }
    else {
      iVar1 = secp256k1_ecmult_context_is_built(in_RDI);
      if (iVar1 == 0) {
        secp256k1_callback_call
                  ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8
                  );
        local_24 = 0;
      }
      else {
        iVar1 = secp256k1_scratch_allocate_frame
                          (in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,
                           (size_t)in_stack_fffffffffffffee8);
        if (iVar1 == 0) {
          local_24 = 0;
        }
        else {
          secp256k1_scratch_alloc(in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
          for (local_68 = 0; local_68 < in_stack_00000010; local_68 = local_68 + 1) {
            secp256k1_pedersen_commitment_load(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          }
          secp256k1_generator_load(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          local_24 = secp256k1_bulletproof_rangeproof_verify_impl
                               (in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                                in_stack_000000f0,(size_t)ctx,(size_t)scratch,(uint64_t **)commit,
                                (secp256k1_ge **)n_commits,nbits,(secp256k1_ge *)value_gen,
                                (secp256k1_bulletproof_generators *)extra_commit,
                                (uchar **)extra_commit_len,in_stack_00000150);
          secp256k1_scratch_deallocate_frame((secp256k1_scratch *)0x1115f0);
        }
      }
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_24 = 0;
  }
  return local_24;
}

Assistant:

int secp256k1_bulletproof_rangeproof_verify(const secp256k1_context* ctx, secp256k1_scratch_space *scratch, const secp256k1_bulletproof_generators *gens, const unsigned char *proof, size_t plen,
 const uint64_t *min_value, const secp256k1_pedersen_commitment* commit, size_t n_commits, size_t nbits, const secp256k1_generator *value_gen, const unsigned char *extra_commit, size_t extra_commit_len) {
    int ret;
    size_t i;
    secp256k1_ge *commitp;
    secp256k1_ge value_genp;
    const secp256k1_ge *commitp_ptr;
    const uint64_t *minvalue_ptr;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(scratch != NULL);
    ARG_CHECK(gens != NULL);
    ARG_CHECK(gens->n >= 2 * nbits * n_commits);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(n_commits > 0);
    ARG_CHECK(nbits > 0);
    ARG_CHECK(nbits <= 64);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));

    if (!secp256k1_scratch_allocate_frame(scratch, 2 * n_commits * sizeof(secp256k1_ge), 1)) {
        return 0;
    }

    commitp = (secp256k1_ge *)secp256k1_scratch_alloc(scratch, n_commits * sizeof(secp256k1_ge));
    for (i = 0; i < n_commits; i++) {
        secp256k1_pedersen_commitment_load(&commitp[i], &commit[i]);
    }
    secp256k1_generator_load(&value_genp, value_gen);

    commitp_ptr = commitp;
    minvalue_ptr = min_value;
    ret = secp256k1_bulletproof_rangeproof_verify_impl(&ctx->ecmult_ctx, scratch, &proof, 1, plen, nbits, &minvalue_ptr, &commitp_ptr, n_commits, &value_genp, gens, &extra_commit, &extra_commit_len);
    secp256k1_scratch_deallocate_frame(scratch);
    return ret;
}